

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

void __thiscall icu_63::Package::~Package(Package *this)

{
  int local_14;
  int32_t idx;
  Package *this_local;
  
  uprv_free_63(this->inData);
  for (local_14 = 0; local_14 < this->itemCount; local_14 = local_14 + 1) {
    if (this->items[local_14].isDataOwned != '\0') {
      uprv_free_63(this->items[local_14].data);
    }
  }
  uprv_free_63(this->items);
  return;
}

Assistant:

Package::~Package() {
    int32_t idx;

    uprv_free(inData);

    for(idx=0; idx<itemCount; ++idx) {
        if(items[idx].isDataOwned) {
            uprv_free(items[idx].data);
        }
    }

    uprv_free((void*)items);
}